

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O0

void __thiscall Fl_Graphics_Driver::xyline(Fl_Graphics_Driver *this,int x,int y,int x1,int y2)

{
  int iVar1;
  undefined2 local_2c;
  undefined2 local_2a;
  short local_28;
  undefined2 local_26;
  XPoint p [3];
  int y2_local;
  int x1_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  p[1] = (XPoint)y2;
  p[2] = (XPoint)x1;
  iVar1 = clip_x(x);
  local_2c = (undefined2)iVar1;
  iVar1 = clip_x(y);
  local_2a = (undefined2)iVar1;
  local_26 = local_2a;
  iVar1 = clip_x((int)p[2]);
  local_28 = (short)iVar1;
  p[0].x = local_28;
  iVar1 = clip_x((int)p[1]);
  p[0].y = (short)iVar1;
  XDrawLines(fl_display,fl_window,fl_gc,&local_2c,3,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::xyline(int x, int y, int x1, int y2) {
#if defined (USE_X11)
  XPoint p[3];
  p[0].x = clip_x(x);  p[0].y = p[1].y = clip_x(y);
  p[1].x = p[2].x = clip_x(x1); p[2].y = clip_x(y2);
  XDrawLines(fl_display, fl_window, fl_gc, p, 3, 0);
#elif defined(WIN32)
  if (y2 < y) y2--;
  else y2++;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x1, y);
  LineTo(fl_gc, x1, y2);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x1, y);
  CGContextAddLineToPoint(fl_gc, x1, y2);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x-0.5, y  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
    CGContextFillRect(fl_gc, CGRectMake(x1  -  fl_quartz_line_width_/2, y2-0.5, fl_quartz_line_width_, 1));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
#error unsupported platform
#endif
}